

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.cpp
# Opt level: O0

Trampoline * __thiscall
DefinitionMeaning::Eval(Trampoline *__return_storage_ptr__,DefinitionMeaning *this,Sexp *act)

{
  bool expr;
  Sexp *value_00;
  Sexp *local_40;
  Sexp *value;
  FrameProtector __frame_prot;
  ContractFrameProtector local_20;
  ContractFrameProtector __contract_frame;
  Sexp *act_local;
  DefinitionMeaning *this_local;
  
  __contract_frame.protected_frame = (ContractFrame *)act;
  ContractFrameProtector::ContractFrameProtector(&local_20,"Eval");
  expr = Sexp::IsActivation((Sexp *)__contract_frame.protected_frame);
  ContractFrameProtector::CheckPrecondition(&local_20,expr,"act->IsActivation()");
  FrameProtector::FrameProtector((FrameProtector *)&value,"Eval");
  FrameProtector::ProtectValue((FrameProtector *)&value,(Sexp **)&__contract_frame,"act");
  local_40 = (Sexp *)0x0;
  FrameProtector::ProtectValue((FrameProtector *)&value,&local_40,"value");
  local_40 = Evaluate(this->binding_value,(Sexp *)__contract_frame.protected_frame);
  Activation::Set((Activation *)(__contract_frame.protected_frame)->function_name,this->up_index,
                  this->right_index,local_40);
  value_00 = GcHeap::AllocateEmpty();
  Trampoline::Trampoline(__return_storage_ptr__,value_00);
  FrameProtector::~FrameProtector((FrameProtector *)&value);
  ContractFrameProtector::~ContractFrameProtector(&local_20);
  return __return_storage_ptr__;
}

Assistant:

Trampoline DefinitionMeaning::Eval(Sexp *act) {
  CONTRACT { PRECONDITION(act->IsActivation()); }